

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void int16_suite::test_minus_one(void)

{
  return_type rVar1;
  value_type input [3];
  decoder decoder;
  undefined4 local_64;
  value local_60;
  uchar local_5c [4];
  decoder local_58;
  
  local_58.input._M_str = local_5c;
  local_5c[2] = 0xff;
  local_5c[0] = 0xb2;
  local_5c[1] = 0xff;
  local_58.input._M_len = 3;
  local_58.current.view._M_len = 0;
  local_58.current.view._M_str = (uchar *)0x0;
  local_58.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_60 = local_58.current.code;
  local_64 = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x11e,"void int16_suite::test_minus_one()",&local_60,&local_64);
  rVar1 = trial::protocol::bintoken::detail::decoder::
          overloader<trial::protocol::bintoken::token::int16>::decode(&local_58);
  local_64 = CONCAT22(local_64._2_2_,rVar1);
  local_60 = ~end;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("decoder.value<token::int16>()","-1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x11f,"void int16_suite::test_minus_one()",&local_64,&local_60);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_60 = local_58.current.code;
  local_64 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x121,"void int16_suite::test_minus_one()",&local_60,&local_64);
  return;
}

Assistant:

void test_minus_one()
{
    const value_type input[] = { token::code::int16, 0xFF, 0xFF };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int16>(), -1);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}